

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O2

void __thiscall
Fl_Text_Display::wrapped_line_counter
          (Fl_Text_Display *this,Fl_Text_Buffer *buf,int startPos,int maxPos,int maxLines,
          bool startPosIsLineStart,int styleBufOffset,int *retPos,int *retLines,int *retLineStart,
          int *retLineEnd,bool countLastLineMissingNewLine)

{
  uint uVar1;
  int pos;
  int pos_00;
  int iVar2;
  int iVar3;
  int pos_01;
  int iVar4;
  int pos_02;
  int pos_03;
  char *pcVar5;
  undefined3 in_register_00000089;
  int iVar6;
  double dVar7;
  double local_58;
  
  iVar4 = this->mWrapMarginPix;
  if (iVar4 == 0) {
    iVar4 = (this->text_area).w;
  }
  if (CONCAT31(in_register_00000089,startPosIsLineStart) == 0) {
    startPos = line_start(this,startPos);
  }
  local_58 = 0.0;
  iVar6 = 0;
  pos_03 = 0;
  pos = startPos;
  do {
    if (buf->mLength <= startPos) {
      *retPos = buf->mLength;
      *retLines = pos_03;
      if ((countLastLineMissingNewLine) && (0 < iVar6)) {
        iVar4 = Fl_Text_Buffer::next_char(buf,pos_03);
        *retLines = iVar4;
      }
      *retLineStart = pos;
      maxPos = buf->mLength;
LAB_001cf3cc:
      *retLineEnd = maxPos;
      return;
    }
    uVar1 = Fl_Text_Buffer::char_at(buf,startPos);
    if (uVar1 == 10) {
      if (maxPos <= startPos) {
        *retPos = maxPos;
        *retLines = pos_03;
        *retLineStart = pos;
        goto LAB_001cf3cc;
      }
      pos_03 = pos_03 + 1;
      pos = Fl_Text_Buffer::next_char(buf,startPos);
      if (maxLines <= pos_03) {
        *retPos = pos;
        *retLines = pos_03;
        *retLineStart = pos;
        maxPos = startPos;
        goto LAB_001cf3cc;
      }
      local_58 = 0.0;
      iVar6 = 0;
    }
    else {
      pcVar5 = buf->mBuf + startPos + ((long)buf->mGapEnd - (long)buf->mGapStart);
      if (startPos < buf->mGapStart) {
        pcVar5 = buf->mBuf + startPos;
      }
      iVar6 = iVar6 + 1;
      dVar7 = measure_proportional_character(this,pcVar5,(int)local_58,startPos + styleBufOffset);
      local_58 = local_58 + dVar7;
    }
    iVar2 = pos;
    pos_00 = startPos;
    if ((double)iVar4 < local_58) {
LAB_001cf166:
      if (pos_00 < pos) {
        iVar2 = Fl_Text_Buffer::next_char(buf,pos);
        if (iVar2 < startPos) {
          iVar2 = startPos;
        }
        iVar6 = iVar6 + 1;
        local_58 = 0.0;
        pos_02 = pos;
        if (pos < buf->mLength) {
          pcVar5 = buf->mBuf + pos + ((long)buf->mGapEnd - (long)buf->mGapStart);
          if (pos < buf->mGapStart) {
            pcVar5 = buf->mBuf + pos;
          }
          local_58 = measure_proportional_character(this,pcVar5,0,startPos + styleBufOffset);
        }
      }
      else {
        uVar1 = Fl_Text_Buffer::char_at(buf,pos_00);
        if ((uVar1 != 0x20) && (uVar1 != 9)) break;
        iVar2 = Fl_Text_Buffer::next_char(buf,pos_00);
        iVar3 = Fl_Text_Buffer::next_char(buf,startPos);
        local_58 = 0.0;
        iVar6 = 0;
        pos_01 = pos_00;
        while (pos_01 = Fl_Text_Buffer::next_char(buf,pos_01), pos_02 = pos_00, pos_01 < iVar3) {
          pcVar5 = buf->mBuf + pos_01 + ((long)buf->mGapEnd - (long)buf->mGapStart);
          if (pos_01 < buf->mGapStart) {
            pcVar5 = buf->mBuf + pos_01;
          }
          dVar7 = measure_proportional_character(this,pcVar5,(int)local_58,pos_01 + styleBufOffset);
          local_58 = local_58 + dVar7;
          iVar6 = iVar6 + 1;
        }
      }
      if (maxPos <= startPos) {
        *retPos = maxPos;
        if (iVar2 <= maxPos) {
          pos = iVar2;
        }
        *retLines = pos_03 + (uint)(iVar2 <= maxPos);
        *retLineStart = pos;
        goto LAB_001cf3cc;
      }
      pos_03 = pos_03 + 1;
      if (maxLines <= pos_03) {
        if (pos_00 < pos) {
          iVar4 = Fl_Text_Buffer::next_char(buf,pos);
          if (iVar4 < startPos) {
            iVar4 = startPos;
          }
        }
        else {
          iVar4 = Fl_Text_Buffer::next_char(buf,pos_02);
          startPos = pos_02;
        }
        *retPos = iVar4;
        *retLines = pos_03;
        *retLineStart = pos;
        maxPos = startPos;
        goto LAB_001cf3cc;
      }
    }
    pos = iVar2;
    startPos = Fl_Text_Buffer::next_char(buf,startPos);
  } while( true );
  pos_00 = Fl_Text_Buffer::prev_char(buf,pos_00);
  goto LAB_001cf166;
}

Assistant:

void Fl_Text_Display::wrapped_line_counter(Fl_Text_Buffer *buf, int startPos,
                                           int maxPos, int maxLines, bool startPosIsLineStart, int styleBufOffset,
                                           int *retPos, int *retLines, int *retLineStart, int *retLineEnd,
                                           bool countLastLineMissingNewLine) const {
  IS_UTF8_ALIGNED2(buf, startPos)
  IS_UTF8_ALIGNED2(buf, maxPos)

  int lineStart, newLineStart = 0, b, p, colNum, wrapMarginPix;
  int i, foundBreak;
  double width;
  int nLines = 0;
  unsigned int c;

  /* Set the wrap margin to the wrap column or the view width */
  if (mWrapMarginPix != 0) {
    wrapMarginPix = mWrapMarginPix;
  } else {
    wrapMarginPix = text_area.w;
  }

  /* Find the start of the line if the start pos is not marked as a
   line start. */
  if (startPosIsLineStart)
    lineStart = startPos;
  else
    lineStart = line_start(startPos);

  /*
   ** Loop until position exceeds maxPos or line count exceeds maxLines.
   ** (actually, continues beyond maxPos to end of line containing maxPos,
   ** in case later characters cause a word wrap back before maxPos)
   */
  colNum = 0;
  width = 0;
  for (p=lineStart; p<buf->length(); p=buf->next_char(p)) {
    c = buf->char_at(p);  // UCS-4

    /* If the character was a newline, count the line and start over,
     otherwise, add it to the width and column counts */
    if (c == '\n') {
      if (p >= maxPos) {
        *retPos = maxPos;
        *retLines = nLines;
        *retLineStart = lineStart;
        *retLineEnd = maxPos;
        return;
      }
      nLines++;
      int p1 = buf->next_char(p);
      if (nLines >= maxLines) {
        *retPos = p1;
        *retLines = nLines;
        *retLineStart = p1;
        *retLineEnd = p;
        return;
      }
      lineStart = p1;
      colNum = 0;
      width = 0;
    } else {
      const char *s = buf->address(p);
      colNum++;
      // FIXME: it is not a good idea to simply add character widths because on
      // some platforms, the width is a floating point value and depends on the
      // previous character as well.
      width += measure_proportional_character(s, (int)width, p+styleBufOffset);
    }

    /* If character exceeded wrap margin, find the break point and wrap there */
    if (width > wrapMarginPix) {
      foundBreak = false;
      for (b=p; b>=lineStart; b=buf->prev_char(b)) {
        c = buf->char_at(b);
        if (c == '\t' || c == ' ') {
          newLineStart = buf->next_char(b);
          colNum = 0;
          width = 0;
          int iMax = buf->next_char(p);
          for (i=buf->next_char(b); i<iMax; i = buf->next_char(i)) {
            width += measure_proportional_character(buf->address(i), (int)width,
                                                    i+styleBufOffset);
            colNum++;
          }
          foundBreak = true;
          break;
        }
      }
      if (b<lineStart) b = lineStart;
      if (!foundBreak) { /* no whitespace, just break at margin */
        newLineStart = max(p, buf->next_char(lineStart));
        colNum++;
	if (b >= buf->length()) { // STR #2730
	  width = 0;
	} else {
	  const char *s = buf->address(b);
	  width = measure_proportional_character(s, 0, p+styleBufOffset);
	}
      }
      if (p >= maxPos) {
        *retPos = maxPos;
        *retLines = maxPos < newLineStart ? nLines : nLines + 1;
        *retLineStart = maxPos < newLineStart ? lineStart : newLineStart;
        *retLineEnd = maxPos;
        return;
      }
      nLines++;
      if (nLines >= maxLines) {
        *retPos = foundBreak ? buf->next_char(b) : max(p, buf->next_char(lineStart));
        *retLines = nLines;
        *retLineStart = lineStart;
        *retLineEnd = foundBreak ? b : p;
        return;
      }
      lineStart = newLineStart;
    }
  }

  /* reached end of buffer before reaching pos or line target */
  *retPos = buf->length();
  *retLines = nLines;
  if (countLastLineMissingNewLine && colNum > 0)
    *retLines = buf->next_char(*retLines);
  *retLineStart = lineStart;
  *retLineEnd = buf->length();
}